

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.cpp
# Opt level: O3

String * __thiscall
Diligent::BuildHLSLSourceString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderCreateInfo *ShaderCI)

{
  char *FileName;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  AppendShaderTypeDefinitions(__return_storage_ptr__,*(SHADER_TYPE *)(this + 0x48));
  if ((*(long *)(this + 0x30) != 0) && (*(int *)(this + 0x38) != 0)) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    AppendShaderMacros(__return_storage_ptr__,(ShaderMacroArray *)(this + 0x30));
  }
  FileName = *(char **)this;
  if (FileName == (char *)0x0) {
    FileName = *(char **)(this + 0x40);
  }
  AppendLine1Marker(__return_storage_ptr__,FileName);
  AppendShaderSourceCode(__return_storage_ptr__,(ShaderCreateInfo *)this);
  return __return_storage_ptr__;
}

Assistant:

String BuildHLSLSourceString(const ShaderCreateInfo& ShaderCI) noexcept(false)
{
    String HLSLSource;

    HLSLSource.append(g_HLSLDefinitions);
    AppendShaderTypeDefinitions(HLSLSource, ShaderCI.Desc.ShaderType);

    if (ShaderCI.Macros)
    {
        HLSLSource += '\n';
        AppendShaderMacros(HLSLSource, ShaderCI.Macros);
    }

    AppendLine1Marker(HLSLSource, ShaderCI.FilePath != nullptr ? ShaderCI.FilePath : ShaderCI.Desc.Name);
    AppendShaderSourceCode(HLSLSource, ShaderCI);

    return HLSLSource;
}